

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O1

xmlOutputBufferPtr
xmlOutputBufferCreateIO
          (xmlOutputWriteCallback iowrite,xmlOutputCloseCallback ioclose,void *ioctx,
          xmlCharEncodingHandlerPtr encoder)

{
  xmlOutputBufferPtr pxVar1;
  
  if (iowrite == (xmlOutputWriteCallback)0x0) {
    xmlCharEncCloseFunc(encoder);
    pxVar1 = (xmlOutputBufferPtr)0x0;
  }
  else {
    pxVar1 = xmlAllocOutputBuffer(encoder);
    if (pxVar1 != (xmlOutputBufferPtr)0x0) {
      pxVar1->context = ioctx;
      pxVar1->writecallback = iowrite;
      pxVar1->closecallback = ioclose;
    }
  }
  return pxVar1;
}

Assistant:

xmlOutputBufferPtr
xmlOutputBufferCreateIO(xmlOutputWriteCallback   iowrite,
	 xmlOutputCloseCallback  ioclose, void *ioctx,
	 xmlCharEncodingHandlerPtr encoder) {
    xmlOutputBufferPtr ret;

    if (iowrite == NULL) {
        xmlCharEncCloseFunc(encoder);
        return(NULL);
    }

    ret = xmlAllocOutputBuffer(encoder);
    if (ret != NULL) {
        ret->context = (void *) ioctx;
	ret->writecallback = iowrite;
	ret->closecallback = ioclose;
    }

    return(ret);
}